

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7
          (MDLImporter *this,uchar *szCurrent,uchar **szCurrentOut,aiMaterial *pcMatOut,uint iType,
          uint iWidth,uint iHeight)

{
  uint *puVar1;
  undefined8 uVar2;
  _Head_base<0UL,_aiTexture_*,_false> _Var3;
  _IEEESingle temp;
  ulong uVar4;
  size_t sVar5;
  pointer paVar6;
  Logger *pLVar7;
  aiTexel *paVar8;
  long lVar9;
  size_t sVar10;
  aiTexture **ppaVar11;
  aiScene *paVar12;
  aiTexture **ppaVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint iType_00;
  long lVar17;
  char cVar18;
  MDLImporter *pMVar19;
  Material_MDL7 *pcMatIn;
  int *szPos;
  float fVar20;
  int iShadingMode;
  float power;
  int referrer;
  _Head_base<0UL,_aiTexture_*,_false> local_478;
  MDLImporter *local_470;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  uint local_454;
  char local_450 [8];
  uchar **local_448;
  float local_43c;
  undefined1 local_438 [1032];
  
  local_478._M_head_impl = (aiTexture *)0x0;
  iType_00 = iType & 0xf;
  local_470 = this;
  local_454 = iType;
  local_448 = szCurrentOut;
  if (iType_00 == 7) {
    if (iHeight != 1) {
      pLVar7 = DefaultLogger::get();
      Logger::warn(pLVar7,
                   "Found a reference to an external texture, but texture height is not equal to 1, which is not supported by MED"
                  );
    }
    local_438[4] = 0;
    memset(local_438 + 5,0x1b,0x3ff);
    sVar5 = strlen((char *)szCurrent);
    sVar10 = 0x400;
    if (sVar5 + 1 < 0x400) {
      sVar10 = sVar5 + 1;
    }
    memcpy(local_438 + 4,szCurrent,sVar10);
    local_438._0_4_ = (int)sVar5;
    this = (MDLImporter *)pcMatOut;
    aiMaterial::AddProperty(pcMatOut,(aiString *)local_438,"$tex.file",1,0);
    szCurrent = szCurrent + sVar10;
    goto LAB_00451855;
  }
  if (iType_00 == 6) {
    if (iHeight != 1) {
      pLVar7 = DefaultLogger::get();
      Logger::warn(pLVar7,
                   "Found a reference to an embedded DDS texture, but texture height is not equal to 1, which is not supported by MED"
                  );
    }
    paVar6 = (pointer)operator_new(0x428);
    paVar6->mWidth = 0;
    paVar6->mHeight = 0;
    paVar6->pcData = (aiTexel *)0x0;
    (paVar6->mFilename).length = 0;
    (paVar6->mFilename).data[0] = '\0';
    memset((paVar6->mFilename).data + 1,0x1b,0x3ff);
    paVar6->achFormatHint[0] = '\0';
    paVar6->achFormatHint[1] = '\0';
    paVar6->achFormatHint[2] = '\0';
    paVar6->achFormatHint[3] = '\0';
    std::__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>::reset
              ((__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_> *)&local_478,paVar6);
    _Var3._M_head_impl = local_478._M_head_impl;
    (local_478._M_head_impl)->mHeight = 0;
    (local_478._M_head_impl)->mWidth = iWidth;
    builtin_strncpy((local_478._M_head_impl)->achFormatHint,"dds",4);
    this = (MDLImporter *)operator_new__((ulong)(local_478._M_head_impl)->mWidth);
    (_Var3._M_head_impl)->pcData = (aiTexel *)this;
    memcpy(this,szCurrent,(ulong)(_Var3._M_head_impl)->mWidth);
    uVar4 = (ulong)iWidth;
  }
  else {
    if (iType_00 == 1) {
      local_438._0_4_ = iWidth;
      pMVar19 = (MDLImporter *)pcMatOut;
      aiMaterial::AddBinaryProperty(pcMatOut,local_438,4,"&&&referrer&&&",0,0,aiPTI_Integer);
      this = pMVar19;
      goto LAB_00451855;
    }
    if ((iType != 0 && iType_00 == 0) && (iHeight == 0 || iWidth == 0)) goto LAB_00451855;
    paVar6 = (pointer)operator_new(0x428);
    paVar6->mWidth = 0;
    paVar6->mHeight = 0;
    paVar6->pcData = (aiTexel *)0x0;
    (paVar6->mFilename).length = 0;
    (paVar6->mFilename).data[0] = '\0';
    memset((paVar6->mFilename).data + 1,0x1b,0x3ff);
    paVar6->achFormatHint[0] = '\0';
    paVar6->achFormatHint[1] = '\0';
    paVar6->achFormatHint[2] = '\0';
    paVar6->achFormatHint[3] = '\0';
    std::__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>::reset
              ((__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_> *)&local_478,paVar6);
    if (iWidth == 0 || iHeight == 0) {
      pLVar7 = DefaultLogger::get();
      Logger::warn(pLVar7,
                   "Found embedded texture, but its width an height are both 0. Is this a joke?");
      (local_478._M_head_impl)->mHeight = 8;
      (local_478._M_head_impl)->mWidth = 8;
      paVar8 = (aiTexel *)operator_new__(0x100);
      (local_478._M_head_impl)->pcData = paVar8;
      lVar9 = 3;
      lVar14 = 0;
      do {
        lVar17 = 0;
        lVar15 = lVar9;
        do {
          uVar4 = (ulong)((uint)lVar14 ^ (uint)lVar17) & 0xffffffffffffff01;
          cVar18 = -(char)uVar4;
          this = (MDLImporter *)CONCAT71((int7)(uVar4 >> 8),cVar18);
          paVar8 = (local_478._M_head_impl)->pcData;
          *(char *)((long)paVar8 + lVar15 + -2) = cVar18;
          *(char *)((long)paVar8 + lVar15 + -3) = cVar18;
          *(char *)((long)paVar8 + lVar15 + -1) = cVar18;
          (&paVar8->b)[lVar15] = 0xff;
          lVar17 = lVar17 + 1;
          lVar15 = lVar15 + 0x20;
        } while (lVar17 != 8);
        lVar14 = lVar14 + 1;
        lVar9 = lVar9 + 4;
      } while (lVar14 != 8);
      goto LAB_00451855;
    }
    (local_478._M_head_impl)->mWidth = iWidth;
    (local_478._M_head_impl)->mHeight = iHeight;
    local_438._0_8_ = local_438._0_8_ & 0xffffffff00000000;
    this = local_470;
    ParseTextureColorData(local_470,szCurrent,iType_00,(uint *)local_438,local_478._M_head_impl);
    uVar4 = local_438._0_8_ & 0xffffffff;
  }
  szCurrent = szCurrent + uVar4;
LAB_00451855:
  _local_468 = (aiColor4D)0x0;
  if (local_478._M_head_impl == (aiTexture *)0x0) {
    stack0xfffffffffffffb9c = SUB1612((undefined1  [16])0x0,4);
    local_468._0_4_ = NAN;
    fVar20 = NAN;
  }
  else {
    _local_468 = ReplaceTextureWithColor(this,local_478._M_head_impl);
    fVar20 = local_468._0_4_;
  }
  if ((local_454 & 0x10) == 0) {
    szPos = (int *)szCurrent;
    if ((~(uint)fVar20 & 0x7f800000) != 0 || ((uint)fVar20 & 0x7fffff) == 0) {
      aiMaterial::AddBinaryProperty(pcMatOut,local_468,0x10,"$clr.diffuse",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty(pcMatOut,local_468,0x10,"$clr.specular",0,0,aiPTI_Float);
    }
  }
  else {
    szPos = (int *)((long)szCurrent + 0x44);
    SizeCheck(local_470,szPos,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x25b);
    uVar2 = *(undefined8 *)szCurrent;
    local_438._8_4_ = *(float *)((long)szCurrent + 8);
    local_438._0_8_ = uVar2;
    if ((~local_468._0_4_ & 0x7f800000) != 0 ||
        ((undefined1  [16])_local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      local_438._0_4_ = (float)local_468._0_4_ * (float)uVar2;
      local_438._4_4_ = (float)local_468._4_4_ * SUB84(uVar2,4);
      local_438._8_4_ = (float)local_438._8_4_ * fStack_460;
    }
    aiMaterial::AddBinaryProperty(pcMatOut,local_438,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    uVar2 = *(undefined8 *)((long)szCurrent + 0x20);
    local_438._8_4_ = *(float *)((long)szCurrent + 0x28);
    local_438._0_8_ = uVar2;
    if ((~local_468._0_4_ & 0x7f800000) != 0 ||
        ((undefined1  [16])_local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      local_438._0_4_ = (float)local_468._0_4_ * (float)uVar2;
      local_438._4_4_ = (float)local_468._4_4_ * SUB84(uVar2,4);
      local_438._8_4_ = (float)local_438._8_4_ * fStack_460;
    }
    aiMaterial::AddBinaryProperty(pcMatOut,local_438,0xc,"$clr.specular",0,0,aiPTI_Float);
    uVar2 = *(undefined8 *)((long)szCurrent + 0x10);
    local_438._8_4_ = *(float *)((long)szCurrent + 0x18);
    local_438._0_8_ = uVar2;
    if ((~local_468._0_4_ & 0x7f800000) != 0 ||
        ((undefined1  [16])_local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      local_438._0_4_ = (float)local_468._0_4_ * (float)uVar2;
      local_438._4_4_ = (float)local_468._4_4_ * SUB84(uVar2,4);
      local_438._8_4_ = (float)local_438._8_4_ * fStack_460;
    }
    aiMaterial::AddBinaryProperty(pcMatOut,local_438,0xc,"$clr.ambient",0,0,aiPTI_Float);
    local_438._0_8_ = *(undefined8 *)((long)szCurrent + 0x30);
    local_438._8_4_ = *(int *)((long)szCurrent + 0x38);
    aiMaterial::AddBinaryProperty(pcMatOut,local_438,0xc,"$clr.emissive",0,0,aiPTI_Float);
    fVar20 = *(float *)((long)szCurrent + 0x1c);
    if ((~local_468._0_4_ & 0x7f800000) != 0 ||
        ((undefined1  [16])_local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar20 = fVar20 * fStack_45c;
    }
    local_438._0_4_ = fVar20;
    aiMaterial::AddBinaryProperty(pcMatOut,local_438,4,"$mat.opacity",0,0,aiPTI_Float);
    local_450[0] = '\x02';
    local_450[1] = '\0';
    local_450[2] = '\0';
    local_450[3] = '\0';
    fVar20 = *(float *)((long)szCurrent + 0x40);
    if ((fVar20 != 0.0) || (NAN(fVar20))) {
      local_450[0] = '\x03';
      local_450[1] = '\0';
      local_450[2] = '\0';
      local_450[3] = '\0';
      local_43c = fVar20;
      aiMaterial::AddBinaryProperty(pcMatOut,&local_43c,4,"$mat.shininess",0,0,aiPTI_Float);
    }
    aiMaterial::AddBinaryProperty(pcMatOut,local_450,4,"$mat.shadingm",0,0,aiPTI_Integer);
  }
  if ((~local_468._0_4_ & 0x7f800000) != 0 ||
      ((undefined1  [16])_local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
    std::__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>::reset
              ((__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_> *)&local_478,
               (pointer)0x0);
  }
  if ((local_454 & 0x20) != 0) {
    SizeCheck(local_470,szPos,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x2b6);
    szPos = (int *)((long)szPos + (long)*szPos + 4);
    SizeCheck(local_470,szPos,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x2ba);
  }
  if ((local_478._M_head_impl != (aiTexture *)0x0) && (local_470->pScene->mNumTextures < 1000)) {
    snprintf(local_450,5,"*%i");
    local_438[4] = 0;
    memset(local_438 + 5,0x1b,0x3ff);
    sVar10 = strlen(local_450);
    memcpy(local_438 + 4,local_450,sVar10 + 1);
    local_438._0_4_ = (int)sVar10;
    aiMaterial::AddProperty(pcMatOut,(aiString *)local_438,"$tex.file",1,0);
    paVar12 = local_470->pScene;
    if (paVar12->mNumTextures == 0) {
      paVar12->mNumTextures = 1;
      ppaVar13 = (aiTexture **)operator_new__(8);
      _Var3._M_head_impl = local_478._M_head_impl;
      local_470->pScene->mTextures = ppaVar13;
      local_478._M_head_impl = (aiTexture *)0x0;
      *local_470->pScene->mTextures = _Var3._M_head_impl;
    }
    else {
      ppaVar13 = paVar12->mTextures;
      ppaVar11 = (aiTexture **)operator_new__((ulong)(paVar12->mNumTextures + 1) << 3);
      _Var3._M_head_impl = local_478._M_head_impl;
      paVar12->mTextures = ppaVar11;
      paVar12 = local_470->pScene;
      if (paVar12->mNumTextures == 0) {
        uVar4 = 0;
      }
      else {
        uVar16 = 0;
        do {
          paVar12->mTextures[uVar16] = ppaVar13[uVar16];
          uVar16 = uVar16 + 1;
          paVar12 = local_470->pScene;
          uVar4 = (ulong)paVar12->mNumTextures;
        } while (uVar16 < uVar4);
      }
      local_478._M_head_impl = (aiTexture *)0x0;
      paVar12->mTextures[uVar4] = _Var3._M_head_impl;
      puVar1 = &local_470->pScene->mNumTextures;
      *puVar1 = *puVar1 + 1;
      if (ppaVar13 != (aiTexture **)0x0) {
        operator_delete__(ppaVar13);
      }
    }
  }
  SizeCheck(local_470,szPos,
            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x2e1);
  _Var3._M_head_impl = local_478._M_head_impl;
  *local_448 = (uchar *)szPos;
  if (local_478._M_head_impl != (aiTexture *)0x0) {
    if ((local_478._M_head_impl)->pcData != (aiTexel *)0x0) {
      operator_delete__((local_478._M_head_impl)->pcData);
    }
    operator_delete(_Var3._M_head_impl);
  }
  return;
}

Assistant:

void MDLImporter::ParseSkinLump_3DGS_MDL7(
    const unsigned char* szCurrent,
    const unsigned char** szCurrentOut,
    aiMaterial* pcMatOut,
    unsigned int iType,
    unsigned int iWidth,
    unsigned int iHeight)
{
    std::unique_ptr<aiTexture> pcNew;

    // get the type of the skin
    unsigned int iMasked = (unsigned int)(iType & 0xF);

    if (0x1 ==  iMasked)
    {
        // ***** REFERENCE TO ANOTHER SKIN INDEX *****
        int referrer = (int)iWidth;
        pcMatOut->AddProperty<int>(&referrer,1,AI_MDL7_REFERRER_MATERIAL);
    }
    else if (0x6 == iMasked)
    {
        // ***** EMBEDDED DDS FILE *****
        if (1 != iHeight)
        {
            ASSIMP_LOG_WARN("Found a reference to an embedded DDS texture, "
                "but texture height is not equal to 1, which is not supported by MED");
        }

        pcNew.reset(new aiTexture());
        pcNew->mHeight = 0;
        pcNew->mWidth = iWidth;

        // place a proper format hint
        pcNew->achFormatHint[0] = 'd';
        pcNew->achFormatHint[1] = 'd';
        pcNew->achFormatHint[2] = 's';
        pcNew->achFormatHint[3] = '\0';

        pcNew->pcData = (aiTexel*) new unsigned char[pcNew->mWidth];
        memcpy(pcNew->pcData,szCurrent,pcNew->mWidth);
        szCurrent += iWidth;
    }
    else if (0x7 == iMasked)
    {
        // ***** REFERENCE TO EXTERNAL FILE *****
        if (1 != iHeight)
        {
            ASSIMP_LOG_WARN("Found a reference to an external texture, "
                "but texture height is not equal to 1, which is not supported by MED");
        }

        aiString szFile;
        const size_t iLen = strlen((const char*)szCurrent);
        size_t iLen2 = iLen+1;
        iLen2 = iLen2 > MAXLEN ? MAXLEN : iLen2;
        memcpy(szFile.data,(const char*)szCurrent,iLen2);
        szFile.length = iLen;

        szCurrent += iLen2;

        // place this as diffuse texture
        pcMatOut->AddProperty(&szFile,AI_MATKEY_TEXTURE_DIFFUSE(0));
    }
    else if (iMasked || !iType || (iType && iWidth && iHeight))
    {
        pcNew.reset(new aiTexture());
        if (!iHeight || !iWidth)
        {
            ASSIMP_LOG_WARN("Found embedded texture, but its width "
                "an height are both 0. Is this a joke?");

            // generate an empty chess pattern
            pcNew->mWidth = pcNew->mHeight = 8;
            pcNew->pcData = new aiTexel[64];
            for (unsigned int x = 0; x < 8;++x)
            {
                for (unsigned int y = 0; y < 8;++y)
                {
                    const bool bSet = ((0 == x % 2 && 0 != y % 2) ||
                        (0 != x % 2 && 0 == y % 2));

                    aiTexel* pc = &pcNew->pcData[y * 8 + x];
                    pc->r = pc->b = pc->g = (bSet?0xFF:0);
                    pc->a = 0xFF;
                }
            }
        }
        else
        {
            // it is a standard color texture. Fill in width and height
            // and call the same function we used for loading MDL5 files

            pcNew->mWidth = iWidth;
            pcNew->mHeight = iHeight;

            unsigned int iSkip = 0;
            ParseTextureColorData(szCurrent,iMasked,&iSkip,pcNew.get());

            // skip length of texture data
            szCurrent += iSkip;
        }
    }

    // sometimes there are MDL7 files which have a monochrome
    // texture instead of material colors ... posssible they have
    // been converted to MDL7 from other formats, such as MDL5
    aiColor4D clrTexture;
    if (pcNew)clrTexture = ReplaceTextureWithColor(pcNew.get());
    else clrTexture.r = get_qnan();

    // check whether a material definition is contained in the skin
    if (iType & AI_MDL7_SKINTYPE_MATERIAL)
    {
        BE_NCONST MDL::Material_MDL7* pcMatIn = (BE_NCONST MDL::Material_MDL7*)szCurrent;
        szCurrent = (unsigned char*)(pcMatIn+1);
        VALIDATE_FILE_SIZE(szCurrent);

        aiColor3D clrTemp;

#define COLOR_MULTIPLY_RGB() \
    if (is_not_qnan(clrTexture.r)) \
        { \
        clrTemp.r *= clrTexture.r; \
        clrTemp.g *= clrTexture.g; \
        clrTemp.b *= clrTexture.b; \
        }

        // read diffuse color
        clrTemp.r = pcMatIn->Diffuse.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Diffuse.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Diffuse.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_DIFFUSE);

        // read specular color
        clrTemp.r = pcMatIn->Specular.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Specular.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Specular.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_SPECULAR);

        // read ambient color
        clrTemp.r = pcMatIn->Ambient.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Ambient.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Ambient.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_AMBIENT);

        // read emissive color
        clrTemp.r = pcMatIn->Emissive.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Emissive.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Emissive.b;
        AI_SWAP4(clrTemp.b);
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_EMISSIVE);

#undef COLOR_MULITPLY_RGB

        // FIX: Take the opacity from the ambient color.
        // The doc say something else, but it is fact that MED exports the
        // opacity like this .... oh well.
        clrTemp.r = pcMatIn->Ambient.a;
        AI_SWAP4(clrTemp.r);
        if (is_not_qnan(clrTexture.r)) {
            clrTemp.r *= clrTexture.a;
        }
        pcMatOut->AddProperty<ai_real>(&clrTemp.r,1,AI_MATKEY_OPACITY);

        // read phong power
        int iShadingMode = (int)aiShadingMode_Gouraud;
        AI_SWAP4(pcMatIn->Power);
        if (0.0f != pcMatIn->Power)
        {
            iShadingMode = (int)aiShadingMode_Phong;
            // pcMatIn is packed, we can't form pointers to its members
            float power = pcMatIn->Power;
            pcMatOut->AddProperty<float>(&power,1,AI_MATKEY_SHININESS);
        }
        pcMatOut->AddProperty<int>(&iShadingMode,1,AI_MATKEY_SHADING_MODEL);
    }
    else if (is_not_qnan(clrTexture.r))
    {
        pcMatOut->AddProperty<aiColor4D>(&clrTexture,1,AI_MATKEY_COLOR_DIFFUSE);
        pcMatOut->AddProperty<aiColor4D>(&clrTexture,1,AI_MATKEY_COLOR_SPECULAR);
    }
    // if the texture could be replaced by a single material color
    // we don't need the texture anymore
    if (is_not_qnan(clrTexture.r))
    {
        pcNew.reset();
    }

    // If an ASCII effect description (HLSL?) is contained in the file,
    // we can simply ignore it ...
    if (iType & AI_MDL7_SKINTYPE_MATERIAL_ASCDEF)
    {
        VALIDATE_FILE_SIZE(szCurrent);
        int32_t iMe = *((int32_t*)szCurrent);
        AI_SWAP4(iMe);
        szCurrent += sizeof(char) * iMe + sizeof(int32_t);
        VALIDATE_FILE_SIZE(szCurrent);
    }

    // If an embedded texture has been loaded setup the corresponding
    // data structures in the aiScene instance
    if (pcNew && pScene->mNumTextures <= 999)
    {

        // place this as diffuse texture
        char szCurrent[5];
        ai_snprintf(szCurrent,5,"*%i",this->pScene->mNumTextures);

        aiString szFile;
        const size_t iLen = strlen((const char*)szCurrent);
        ::memcpy(szFile.data,(const char*)szCurrent,iLen+1);
        szFile.length = iLen;

        pcMatOut->AddProperty(&szFile,AI_MATKEY_TEXTURE_DIFFUSE(0));

        // store the texture
        if (!pScene->mNumTextures)
        {
            pScene->mNumTextures = 1;
            pScene->mTextures = new aiTexture*[1];
            pScene->mTextures[0] = pcNew.release();
        }
        else
        {
            aiTexture** pc = pScene->mTextures;
            pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
            for (unsigned int i = 0; i < pScene->mNumTextures;++i) {
                pScene->mTextures[i] = pc[i];
            }

            pScene->mTextures[pScene->mNumTextures] = pcNew.release();
            pScene->mNumTextures++;
            delete[] pc;
        }
    }
    VALIDATE_FILE_SIZE(szCurrent);
    *szCurrentOut = szCurrent;
}